

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O3

void __thiscall xray_re::xr_ogf_v4::load_omf(xr_ogf_v4 *this,xr_reader *r)

{
  xr_reader *r_00;
  xr_reader *s;
  xr_reader *local_20;
  
  (this->super_xr_ogf).m_model_type = MT4_OMF;
  r_00 = xr_reader::open_chunk(r,0xf);
  local_20 = r_00;
  if (r_00 == (xr_reader *)0x0) {
    __assert_fail("s != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x2ea,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
  }
  load_s_smparams(this,r_00);
  if ((r_00->field_2).m_p <= r_00->m_end) {
    if ((r_00->field_2).m_p != r_00->m_end) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                    ,0x2ec,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
    }
    xr_reader::close_chunk(r,&local_20);
    local_20 = xr_reader::open_chunk(r,0xe);
    if (local_20 == (xr_reader *)0x0) {
      __assert_fail("s != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                    ,0x2f0,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
    }
    load_s_motions(this,local_20);
    if ((local_20->field_2).m_p <= local_20->m_end) {
      if ((local_20->field_2).m_p == local_20->m_end) {
        xr_reader::close_chunk(r,&local_20);
        xr_ogf::check_unhandled_chunks(&this->super_xr_ogf,r);
        return;
      }
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                    ,0x2f2,"void xray_re::xr_ogf_v4::load_omf(xr_reader &)");
    }
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7e,"bool xray_re::xr_reader::eof() const");
}

Assistant:

void xr_ogf_v4::load_omf(xr_reader& r)
{
	m_model_type = MT4_OMF;

	xr_reader* s = r.open_chunk(OGF4_S_SMPARAMS);
	xr_assert(s != 0);
	load_s_smparams(*s);
	assert(s->eof());
	r.close_chunk(s);

	s = r.open_chunk(OGF4_S_MOTIONS);
	xr_assert(s != 0);
	load_s_motions(*s);
	assert(s->eof());
	r.close_chunk(s);

	check_unhandled_chunks(r);
}